

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

void __thiscall
Hospital::Remove_Doctor
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *id)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  pointer pDVar3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pDVar3 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
      super__Vector_impl_data._M_finish != pDVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      Doctor::doctor_all_ino_getter_abi_cxx11_
                (&local_48,(Doctor *)((long)&(pDVar3->super_Human).Id._M_dataplus._M_p + lVar5));
      __n = (local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      if (__n == id->_M_string_length) {
        if (__n == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
LAB_0011ddf5:
          std::vector<Doctor,_std::allocator<Doctor>_>::_M_erase
                    (All_Of_Doctors,
                     (Doctor *)
                     ((long)&(((All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)
                               ._M_impl.super__Vector_impl_data._M_start)->super_Human).Id.
                             _M_dataplus + lVar5));
          return;
        }
        iVar1 = bcmp(((local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                     (id->_M_dataplus)._M_p,__n);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        if (iVar1 == 0) goto LAB_0011ddf5;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
      uVar4 = uVar4 + 1;
      pDVar3 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pDVar3 >> 3) * 0x51b3bea3677d46cf;
      lVar5 = lVar5 + 0x178;
    } while (uVar4 <= uVar2 && uVar2 - uVar4 != 0);
  }
  return;
}

Assistant:

void Hospital :: Remove_Doctor(vector<Doctor> &All_Of_Doctors, string id){

    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if(All_Of_Doctors[i].doctor_all_ino_getter()[0] == id){
            All_Of_Doctors.erase(All_Of_Doctors.begin()+i);
            ///remove from files
            break;
        }
    }
}